

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

bool __thiscall ON_Xform::IsAffine(ON_Xform *this)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  
  dVar2 = this->m_xform[3][0];
  bVar3 = false;
  bVar4 = false;
  if (((((dVar2 == 0.0) && (bVar4 = bVar3, !NAN(dVar2))) &&
       (dVar2 = this->m_xform[3][1], dVar2 == 0.0)) &&
      ((!NAN(dVar2) && (dVar2 = this->m_xform[3][2], dVar2 == 0.0)))) &&
     ((!NAN(dVar2) && ((dVar2 = this->m_xform[3][3], dVar2 == 1.0 && (!NAN(dVar2))))))) {
    uVar5 = 0;
    do {
      bVar4 = 0x7f < uVar5;
      if (0x7f < uVar5) {
        return bVar4;
      }
      pdVar1 = (double *)((long)this->m_xform[0] + uVar5);
      uVar5 = uVar5 + 8;
    } while (ABS(*pdVar1) < 1.23432101234321e+308);
  }
  return bVar4;
}

Assistant:

bool ON_Xform::IsAffine() const
{
  return (
    0.0 == m_xform[3][0] 
    && 0.0 == m_xform[3][1] 
    && 0.0 == m_xform[3][2] 
    && 1.0 == m_xform[3][3] 
    && IsValid());
}